

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O0

void llvm::cl::applicator<llvm::cl::LocationClass<(anonymous_namespace)::HelpPrinterWrapper>>::
     opt<llvm::cl::opt<(anonymous_namespace)::HelpPrinterWrapper,true,llvm::cl::parser<bool>>>
               (LocationClass<(anonymous_namespace)::HelpPrinterWrapper> *M,
               opt<(anonymous_namespace)::HelpPrinterWrapper,_true,_llvm::cl::parser<bool>_> *O)

{
  opt<(anonymous_namespace)::HelpPrinterWrapper,_true,_llvm::cl::parser<bool>_> *O_local;
  LocationClass<(anonymous_namespace)::HelpPrinterWrapper> *M_local;
  
  LocationClass<(anonymous_namespace)::HelpPrinterWrapper>::
  apply<llvm::cl::opt<(anonymous_namespace)::HelpPrinterWrapper,true,llvm::cl::parser<bool>>>(M,O);
  return;
}

Assistant:

static void opt(const Mod &M, Opt &O) { M.apply(O); }